

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_helper_mffscrn(DisasContext_conflict10 *ctx,TCGv_i64 t1)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i32 arg3;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  arg3 = tcg_const_i32_ppc64(tcg_ctx,1);
  gen_reset_fpstatus(tcg_ctx);
  tcg_gen_mov_i64_ppc64(tcg_ctx,ret,cpu_fpscr);
  tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,0x7000000fb);
  set_fpr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f,ret);
  tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,-4);
  tcg_gen_or_i64_ppc64(tcg_ctx,ret,ret,t1);
  gen_helper_store_fpscr(tcg_ctx,tcg_ctx->cpu_env,ret,arg3);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_helper_mffscrn(DisasContext *ctx, TCGv_i64 t1)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i32 mask = tcg_const_i32(tcg_ctx, 0x0001);

    gen_reset_fpstatus(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_fpscr);
    tcg_gen_andi_i64(tcg_ctx, t0, t0, FP_DRN | FP_ENABLES | FP_RN);
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);

    /* Mask FPSCR value to clear RN.  */
    tcg_gen_andi_i64(tcg_ctx, t0, t0, ~FP_RN);

    /* Merge RN into FPSCR value.  */
    tcg_gen_or_i64(tcg_ctx, t0, t0, t1);

    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t0, mask);

    tcg_temp_free_i32(tcg_ctx, mask);
    tcg_temp_free_i64(tcg_ctx, t0);
}